

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

BOOLEAN __thiscall BVStatic<2048UL>::Test(BVStatic<2048UL> *this,BVIndex i)

{
  AssertRange(this,i);
  AssertRange(this,i);
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  return (this->data[i >> 6].word >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN Test(BVIndex i) const
    {
        AssertRange(i);
        return this->BitsFromIndex(i)->Test(BVUnit::Offset(i));
    }